

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::insert<void_const*,void_const*&>
          (HashIndex<kj::_::HashSetCallbacks> *this,ArrayPtr<const_void_*> table,size_t pos,
          Entry *params)

{
  size_t *psVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  Entry ptr;
  uint uVar4;
  undefined8 unaff_RBX;
  Entry *this_00;
  HashBucket *pHVar5;
  uint uVar6;
  Disposer *pDVar7;
  long *in_R9;
  HashBucket *pHVar8;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  Maybe<unsigned_long> MVar9;
  undefined8 unaff_retaddr;
  
  this_00 = table.ptr;
  if ((ulong)((long)(this_00->value).dir.disposer * 2) < ((this_00->key).parts.size_ + pos) * 3 + 3)
  {
    rehash((HashIndex<kj::_::HashSetCallbacks> *)this_00,pos * 3 + 3);
  }
  ptr.key.parts.size_ = unaff_R12;
  ptr.key.parts.ptr = (String *)unaff_RBX;
  ptr.key.parts.disposer = (ArrayDisposer *)unaff_R13;
  ptr.value.dir.disposer = (Disposer *)unaff_R14;
  ptr.value.dir.ptr = (ReadableDirectory *)unaff_R15;
  ptr.value._16_8_ = unaff_retaddr;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,ptr);
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->value).dir.disposer;
  uVar6 = (int)aVar3.value - 1U & uVar4;
  pHVar5 = (HashBucket *)0x0;
  do {
    pHVar8 = ((Array<kj::_::HashBucket> *)&(this_00->key).parts.disposer)->ptr + uVar6;
    uVar2 = pHVar8->value;
    if (uVar2 == 1) {
      if (pHVar5 == (HashBucket *)0x0) {
        pHVar5 = pHVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar5 != (HashBucket *)0x0) {
          psVar1 = &(this_00->key).parts.size_;
          *psVar1 = *psVar1 - 1;
          pHVar8 = pHVar5;
        }
        *pHVar8 = (HashBucket)(((ulong)uVar4 | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
        goto LAB_0018a5b7;
      }
      if ((pHVar8->hash == uVar4) && (*(long *)(table.size_ + (ulong)(uVar2 - 2) * 8) == *in_R9)) {
        *(undefined1 *)this = 1;
        this->erasedCount = (ulong)(uVar2 - 2);
LAB_0018a5b7:
        MVar9.ptr.field_1.value = aVar3.value;
        MVar9.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar9.ptr;
      }
    }
    pDVar7 = (Disposer *)((ulong)uVar6 + 1);
    uVar6 = (uint)pDVar7;
    if (pDVar7 == (Disposer *)aVar3.value) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }